

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

void uxpgnt_log(PageantListenerClient *plc,char *fmt,__va_list_tag *ap)

{
  if (*(FILE **)&plc[-3].suppress_logging != (FILE *)0x0) {
    fwrite("pageant: ",9,1,*(FILE **)&plc[-3].suppress_logging);
    vfprintf(*(FILE **)&plc[-3].suppress_logging,fmt,ap);
    fputc(10,*(FILE **)&plc[-3].suppress_logging);
    return;
  }
  return;
}

Assistant:

static void uxpgnt_log(PageantListenerClient *plc, const char *fmt, va_list ap)
{
    struct uxpgnt_client *upc = container_of(plc, struct uxpgnt_client, plc);

    if (!upc->logfp)
        return;

    fprintf(upc->logfp, "pageant: ");
    vfprintf(upc->logfp, fmt, ap);
    fprintf(upc->logfp, "\n");
}